

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O1

Pla_Man_t * Pla_GenFromMinterms(char *pName,Vec_Int_t *vMints,int nVars)

{
  ulong *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  word *pwVar6;
  Pla_Man_t *pPVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  byte bVar13;
  
  pPVar7 = Pla_ManAlloc(pName,nVars,1,vMints->nSize);
  iVar2 = (pPVar7->vCubes).nSize;
  lVar8 = (long)iVar2;
  if (0 < lVar8) {
    iVar3 = pPVar7->nInWords;
    lVar11 = 0;
    do {
      lVar12 = lVar11 * iVar3;
      if ((lVar12 < 0) || ((pPVar7->vInBits).nSize <= lVar12)) goto LAB_003f8396;
      if (vMints->nSize <= lVar11) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar4 = pPVar7->nIns;
      if (0 < (int)uVar4) {
        pwVar6 = (pPVar7->vInBits).pArray;
        uVar5 = vMints->pArray[lVar11];
        bVar13 = 0;
        uVar10 = 0;
        do {
          puVar1 = pwVar6 + lVar12 + (uVar10 >> 5);
          *puVar1 = *puVar1 | (ulong)((uVar5 >> ((uint)uVar10 & 0x1f) & 1) != 0) + 1 <<
                              (bVar13 & 0x3e);
          uVar9 = (uint)uVar10 + 1;
          uVar10 = (ulong)uVar9;
          bVar13 = bVar13 + 2;
        } while (uVar4 != uVar9);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != lVar8);
  }
  if (0 < iVar2) {
    iVar2 = pPVar7->nOutWords;
    lVar11 = 0;
    do {
      if ((lVar11 < 0) ||
         (lVar12 = lVar11 + iVar2, (long)(pPVar7->vOutBits).nSize <= lVar12 - iVar2)) {
LAB_003f8396:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      puVar1 = (pPVar7->vOutBits).pArray + lVar11;
      *puVar1 = *puVar1 | 2;
      lVar8 = lVar8 + -1;
      lVar11 = lVar12;
    } while (lVar8 != 0);
  }
  return pPVar7;
}

Assistant:

Pla_Man_t * Pla_GenFromMinterms( char * pName, Vec_Int_t * vMints, int nVars )
{
    Pla_Man_t * p = Pla_ManAlloc( pName, nVars, 1, Vec_IntSize(vMints) );
    int i, k, Lit, Mint;
    word * pCube;
    Pla_ForEachCubeIn( p, pCube, i )
    {
        Mint = Vec_IntEntry(vMints, i);
        Pla_CubeForEachLitIn( p, pCube, Lit, k )
            Pla_CubeSetLit( pCube, k, ((Mint >> k) & 1) ? PLA_LIT_ONE : PLA_LIT_ZERO );
    }
    Pla_ForEachCubeOut( p, pCube, i )
        Pla_CubeSetLit( pCube, 0, PLA_LIT_ONE );
    return p;
}